

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::JunitReporter::JunitReporter(JunitReporter *this,ReporterConfig *_config)

{
  IConfig *pIVar1;
  ostream *poVar2;
  
  (this->super_CumulativeReporterBase).super_SharedImpl<Catch::IStreamingReporter>.m_rc = 0;
  (this->super_CumulativeReporterBase).super_SharedImpl<Catch::IStreamingReporter>.
  super_IStreamingReporter.super_IShared.super_NonCopyable._vptr_NonCopyable =
       (_func_int **)&PTR__CumulativeReporterBase_0015f590;
  pIVar1 = (_config->m_fullConfig).m_p;
  (this->super_CumulativeReporterBase).m_config.m_p = pIVar1;
  if (pIVar1 != (IConfig *)0x0) {
    (*(pIVar1->super_IShared).super_NonCopyable._vptr_NonCopyable[2])();
  }
  (this->super_CumulativeReporterBase).stream = _config->m_stream;
  memset(&(this->super_CumulativeReporterBase).m_assertions,0,0xa0);
  (this->super_CumulativeReporterBase).super_SharedImpl<Catch::IStreamingReporter>.
  super_IStreamingReporter.super_IShared.super_NonCopyable._vptr_NonCopyable =
       (_func_int **)&PTR__JunitReporter_0015f750;
  poVar2 = _config->m_stream;
  (this->xml).m_tagIsOpen = false;
  (this->xml).m_needsNewline = false;
  (this->xml).m_tags.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->xml).m_tags.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->xml).m_tags.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->xml).m_indent._M_dataplus._M_p = (pointer)&(this->xml).m_indent.field_2;
  (this->xml).m_indent._M_string_length = 0;
  (this->xml).m_indent.field_2._M_local_buf[0] = '\0';
  (this->xml).m_os = poVar2;
  (this->suiteTimer).m_ticks = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&this->stdOutForSuite);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&this->stdErrForSuite);
  return;
}

Assistant:

JunitReporter( ReporterConfig const& _config )
        :   CumulativeReporterBase( _config ),
            xml( _config.stream() )
        {}